

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::BNLL_x86_avx512::forward_inplace(BNLL_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  int iVar49;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 (*pauVar50) [64];
  int iVar51;
  ulong uVar52;
  ulong uVar53;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  float fVar83;
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar67 [32];
  undefined1 auVar71 [32];
  
  iVar49 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  auVar73 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar74 = vxorps_avx512dq(auVar73,(undefined1  [64])_ps512_cephes_exp_C1);
  auVar75 = vxorps_avx512dq(auVar73,(undefined1  [64])_ps512_cephes_exp_C2);
  auVar73 = vxorps_avx512dq(auVar73,(undefined1  [64])_ps512_cephes_exp_p5);
  uVar53 = 0;
  uVar52 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar52 = uVar53;
  }
  for (; uVar53 != uVar52; uVar53 = uVar53 + 1) {
    pauVar50 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar53 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    for (iVar51 = 0; iVar51 + 0xf < iVar49; iVar51 = iVar51 + 0x10) {
      auVar76._8_4_ = 0x80000000;
      auVar76._0_8_ = 0x8000000080000000;
      auVar76._12_4_ = 0x80000000;
      auVar76._16_4_ = 0x80000000;
      auVar76._20_4_ = 0x80000000;
      auVar76._24_4_ = 0x80000000;
      auVar76._28_4_ = 0x80000000;
      auVar76._32_4_ = 0x80000000;
      auVar76._36_4_ = 0x80000000;
      auVar76._40_4_ = 0x80000000;
      auVar76._44_4_ = 0x80000000;
      auVar76._48_4_ = 0x80000000;
      auVar76._52_4_ = 0x80000000;
      auVar76._56_4_ = 0x80000000;
      auVar76._60_4_ = 0x80000000;
      auVar76 = vorps_avx512dq(*pauVar50,auVar76);
      auVar76 = vminps_avx512f(auVar76,(undefined1  [64])_ps512_exp_hi);
      auVar76 = vmaxps_avx512f(auVar76,(undefined1  [64])_ps512_exp_lo);
      auVar77 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_LOG2EF,auVar76,
                                    (undefined1  [64])_ps512_cephes_exp_p5);
      auVar78 = vrndscaleps_avx512f(auVar77,1);
      uVar7 = vcmpps_avx512f(auVar77,auVar78,1);
      auVar77 = vsubps_avx512f(auVar78,(undefined1  [64])_ps512_1);
      bVar5 = (bool)((byte)uVar7 & 1);
      auVar79._0_4_ = (uint)bVar5 * auVar77._0_4_ | (uint)!bVar5 * auVar78._0_4_;
      bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar79._4_4_ = (uint)bVar5 * auVar77._4_4_ | (uint)!bVar5 * auVar78._4_4_;
      bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar79._8_4_ = (uint)bVar5 * auVar77._8_4_ | (uint)!bVar5 * auVar78._8_4_;
      bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar79._12_4_ = (uint)bVar5 * auVar77._12_4_ | (uint)!bVar5 * auVar78._12_4_;
      bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
      auVar79._16_4_ = (uint)bVar5 * auVar77._16_4_ | (uint)!bVar5 * auVar78._16_4_;
      bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
      auVar79._20_4_ = (uint)bVar5 * auVar77._20_4_ | (uint)!bVar5 * auVar78._20_4_;
      bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
      auVar79._24_4_ = (uint)bVar5 * auVar77._24_4_ | (uint)!bVar5 * auVar78._24_4_;
      bVar5 = (bool)((byte)(uVar7 >> 7) & 1);
      auVar79._28_4_ = (uint)bVar5 * auVar77._28_4_ | (uint)!bVar5 * auVar78._28_4_;
      bVar5 = (bool)((byte)(uVar7 >> 8) & 1);
      auVar79._32_4_ = (uint)bVar5 * auVar77._32_4_ | (uint)!bVar5 * auVar78._32_4_;
      bVar5 = (bool)((byte)(uVar7 >> 9) & 1);
      auVar79._36_4_ = (uint)bVar5 * auVar77._36_4_ | (uint)!bVar5 * auVar78._36_4_;
      bVar5 = (bool)((byte)(uVar7 >> 10) & 1);
      auVar79._40_4_ = (uint)bVar5 * auVar77._40_4_ | (uint)!bVar5 * auVar78._40_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xb) & 1);
      auVar79._44_4_ = (uint)bVar5 * auVar77._44_4_ | (uint)!bVar5 * auVar78._44_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xc) & 1);
      auVar79._48_4_ = (uint)bVar5 * auVar77._48_4_ | (uint)!bVar5 * auVar78._48_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xd) & 1);
      auVar79._52_4_ = (uint)bVar5 * auVar77._52_4_ | (uint)!bVar5 * auVar78._52_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xe) & 1);
      auVar79._56_4_ = (uint)bVar5 * auVar77._56_4_ | (uint)!bVar5 * auVar78._56_4_;
      bVar5 = SUB81(uVar7 >> 0xf,0);
      auVar79._60_4_ = (uint)bVar5 * auVar77._60_4_ | (uint)!bVar5 * auVar78._60_4_;
      auVar76 = vfmadd231ps_avx512f(auVar76,auVar79,auVar74);
      auVar76 = vfmadd231ps_avx512f(auVar76,auVar79,auVar75);
      auVar77 = vmulps_avx512f(auVar76,auVar76);
      auVar78 = vfmadd132ps_avx512f(auVar76,(undefined1  [64])_ps512_cephes_exp_p1,
                                    (undefined1  [64])_ps512_cephes_exp_p0);
      auVar78 = vfmadd213ps_avx512f(auVar78,auVar76,(undefined1  [64])_ps512_cephes_exp_p2);
      auVar78 = vfmadd213ps_avx512f(auVar78,auVar76,(undefined1  [64])_ps512_cephes_exp_p3);
      auVar78 = vfmadd213ps_avx512f(auVar78,auVar76,(undefined1  [64])_ps512_cephes_exp_p4);
      auVar78 = vfmadd213ps_avx512f(auVar78,auVar76,(undefined1  [64])_ps512_cephes_exp_p5);
      auVar76 = vfmadd213ps_avx512f(auVar78,auVar77,auVar76);
      auVar76 = vaddps_avx512f(auVar76,(undefined1  [64])_ps512_1);
      auVar77 = vcvttps2dq_avx512f(auVar79);
      auVar78 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar77 = vpaddd_avx512f(auVar78,auVar77);
      auVar79 = vpslld_avx512f(auVar77,0x17);
      auVar77._8_4_ = 0x3f800000;
      auVar77._0_8_ = 0x3f8000003f800000;
      auVar77._12_4_ = 0x3f800000;
      auVar77._16_4_ = 0x3f800000;
      auVar77._20_4_ = 0x3f800000;
      auVar77._24_4_ = 0x3f800000;
      auVar77._28_4_ = 0x3f800000;
      auVar77._32_4_ = 0x3f800000;
      auVar77._36_4_ = 0x3f800000;
      auVar77._40_4_ = 0x3f800000;
      auVar77._44_4_ = 0x3f800000;
      auVar77._48_4_ = 0x3f800000;
      auVar77._52_4_ = 0x3f800000;
      auVar77._56_4_ = 0x3f800000;
      auVar77._60_4_ = 0x3f800000;
      auVar76 = vfmadd213ps_avx512f(auVar79,auVar76,auVar77);
      auVar77 = vmaxps_avx512f(auVar76,(undefined1  [64])_ps512_min_norm_pos);
      auVar79 = vpsrld_avx512f(auVar77,0x17);
      auVar77 = vpternlogd_avx512f(auVar77,(undefined1  [64])_ps512_cephes_exp_p5,
                                   (undefined1  [64])_ps512_inv_mant_mask,0xec);
      uVar7 = vcmpps_avx512f(auVar77,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      auVar80 = vsubps_avx512f(auVar77,(undefined1  [64])_ps512_1);
      auVar77 = vaddps_avx512f(auVar80,auVar77);
      bVar5 = (bool)((byte)uVar7 & 1);
      auVar81._0_4_ = (uint)bVar5 * auVar77._0_4_ | (uint)!bVar5 * auVar80._0_4_;
      bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar81._4_4_ = (uint)bVar5 * auVar77._4_4_ | (uint)!bVar5 * auVar80._4_4_;
      bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar81._8_4_ = (uint)bVar5 * auVar77._8_4_ | (uint)!bVar5 * auVar80._8_4_;
      bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar81._12_4_ = (uint)bVar5 * auVar77._12_4_ | (uint)!bVar5 * auVar80._12_4_;
      bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
      auVar81._16_4_ = (uint)bVar5 * auVar77._16_4_ | (uint)!bVar5 * auVar80._16_4_;
      bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
      auVar81._20_4_ = (uint)bVar5 * auVar77._20_4_ | (uint)!bVar5 * auVar80._20_4_;
      bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
      auVar81._24_4_ = (uint)bVar5 * auVar77._24_4_ | (uint)!bVar5 * auVar80._24_4_;
      bVar5 = (bool)((byte)(uVar7 >> 7) & 1);
      auVar81._28_4_ = (uint)bVar5 * auVar77._28_4_ | (uint)!bVar5 * auVar80._28_4_;
      bVar6 = (byte)(uVar7 >> 8);
      bVar5 = (bool)(bVar6 & 1);
      auVar81._32_4_ = (uint)bVar5 * auVar77._32_4_ | (uint)!bVar5 * auVar80._32_4_;
      bVar5 = (bool)((byte)(uVar7 >> 9) & 1);
      auVar81._36_4_ = (uint)bVar5 * auVar77._36_4_ | (uint)!bVar5 * auVar80._36_4_;
      bVar5 = (bool)((byte)(uVar7 >> 10) & 1);
      auVar81._40_4_ = (uint)bVar5 * auVar77._40_4_ | (uint)!bVar5 * auVar80._40_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xb) & 1);
      auVar81._44_4_ = (uint)bVar5 * auVar77._44_4_ | (uint)!bVar5 * auVar80._44_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xc) & 1);
      auVar81._48_4_ = (uint)bVar5 * auVar77._48_4_ | (uint)!bVar5 * auVar80._48_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xd) & 1);
      auVar81._52_4_ = (uint)bVar5 * auVar77._52_4_ | (uint)!bVar5 * auVar80._52_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xe) & 1);
      auVar81._56_4_ = (uint)bVar5 * auVar77._56_4_ | (uint)!bVar5 * auVar80._56_4_;
      bVar5 = SUB81(uVar7 >> 0xf,0);
      auVar81._60_4_ = (uint)bVar5 * auVar77._60_4_ | (uint)!bVar5 * auVar80._60_4_;
      auVar77 = vmulps_avx512f(auVar81,auVar81);
      auVar80 = vfmadd132ps_avx512f(auVar81,(undefined1  [64])_ps512_cephes_log_p1,
                                    (undefined1  [64])_ps512_cephes_log_p0);
      auVar80 = vfmadd213ps_avx512f(auVar80,auVar81,(undefined1  [64])_ps512_cephes_log_p2);
      auVar80 = vfmadd213ps_avx512f(auVar80,auVar81,(undefined1  [64])_ps512_cephes_log_p3);
      auVar80 = vfmadd213ps_avx512f(auVar80,auVar81,(undefined1  [64])_ps512_cephes_log_p4);
      auVar80 = vfmadd213ps_avx512f(auVar80,auVar81,(undefined1  [64])_ps512_cephes_log_p5);
      auVar80 = vfmadd213ps_avx512f(auVar80,auVar81,(undefined1  [64])_ps512_cephes_log_p6);
      auVar80 = vfmadd213ps_avx512f(auVar80,auVar81,(undefined1  [64])_ps512_cephes_log_p7);
      auVar80 = vfmadd213ps_avx512f(auVar80,auVar81,(undefined1  [64])_ps512_cephes_log_p8);
      auVar82 = vmulps_avx512f(auVar77,auVar81);
      auVar80 = vfmadd213ps_avx512f(auVar82,auVar80,auVar81);
      uVar8 = vcmpps_avx512f(auVar76,ZEXT864(0) << 0x20,2);
      auVar76 = vpsubd_avx512f(auVar79,auVar78);
      auVar76 = vcvtdq2ps_avx512f(auVar76);
      auVar78 = vaddps_avx512f(auVar76,(undefined1  [64])_ps512_1);
      bVar5 = (bool)((byte)uVar7 & 1);
      auVar82._0_4_ = (uint)bVar5 * auVar76._0_4_ | (uint)!bVar5 * auVar78._0_4_;
      bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar82._4_4_ = (uint)bVar5 * auVar76._4_4_ | (uint)!bVar5 * auVar78._4_4_;
      bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar82._8_4_ = (uint)bVar5 * auVar76._8_4_ | (uint)!bVar5 * auVar78._8_4_;
      bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar82._12_4_ = (uint)bVar5 * auVar76._12_4_ | (uint)!bVar5 * auVar78._12_4_;
      bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
      auVar82._16_4_ = (uint)bVar5 * auVar76._16_4_ | (uint)!bVar5 * auVar78._16_4_;
      bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
      auVar82._20_4_ = (uint)bVar5 * auVar76._20_4_ | (uint)!bVar5 * auVar78._20_4_;
      bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
      auVar82._24_4_ = (uint)bVar5 * auVar76._24_4_ | (uint)!bVar5 * auVar78._24_4_;
      bVar5 = (bool)((byte)(uVar7 >> 7) & 1);
      auVar82._28_4_ = (uint)bVar5 * auVar76._28_4_ | (uint)!bVar5 * auVar78._28_4_;
      bVar5 = (bool)(bVar6 & 1);
      auVar82._32_4_ = (uint)bVar5 * auVar76._32_4_ | (uint)!bVar5 * auVar78._32_4_;
      bVar5 = (bool)((byte)(uVar7 >> 9) & 1);
      auVar82._36_4_ = (uint)bVar5 * auVar76._36_4_ | (uint)!bVar5 * auVar78._36_4_;
      bVar5 = (bool)((byte)(uVar7 >> 10) & 1);
      auVar82._40_4_ = (uint)bVar5 * auVar76._40_4_ | (uint)!bVar5 * auVar78._40_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xb) & 1);
      auVar82._44_4_ = (uint)bVar5 * auVar76._44_4_ | (uint)!bVar5 * auVar78._44_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xc) & 1);
      auVar82._48_4_ = (uint)bVar5 * auVar76._48_4_ | (uint)!bVar5 * auVar78._48_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xd) & 1);
      auVar82._52_4_ = (uint)bVar5 * auVar76._52_4_ | (uint)!bVar5 * auVar78._52_4_;
      bVar5 = (bool)((byte)(uVar7 >> 0xe) & 1);
      auVar82._56_4_ = (uint)bVar5 * auVar76._56_4_ | (uint)!bVar5 * auVar78._56_4_;
      bVar5 = SUB81(uVar7 >> 0xf,0);
      auVar82._60_4_ = (uint)bVar5 * auVar76._60_4_ | (uint)!bVar5 * auVar78._60_4_;
      auVar76 = vfmadd231ps_avx512f(auVar80,auVar82,(undefined1  [64])_ps512_cephes_exp_C2);
      auVar76 = vfmadd231ps_avx512f(auVar76,auVar77,auVar73);
      auVar76 = vfmadd231ps_avx512f(auVar76,auVar82,(undefined1  [64])_ps512_cephes_exp_C1);
      bVar5 = (bool)((byte)uVar8 & 1);
      auVar78._0_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._0_4_;
      bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar78._4_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._4_4_;
      bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar78._8_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._8_4_;
      bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar78._12_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._12_4_;
      bVar5 = (bool)((byte)(uVar8 >> 4) & 1);
      auVar78._16_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._16_4_;
      bVar5 = (bool)((byte)(uVar8 >> 5) & 1);
      auVar78._20_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._20_4_;
      bVar5 = (bool)((byte)(uVar8 >> 6) & 1);
      auVar78._24_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._24_4_;
      bVar5 = (bool)((byte)(uVar8 >> 7) & 1);
      auVar78._28_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._28_4_;
      bVar5 = (bool)((byte)(uVar8 >> 8) & 1);
      auVar78._32_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._32_4_;
      bVar5 = (bool)((byte)(uVar8 >> 9) & 1);
      auVar78._36_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._36_4_;
      bVar5 = (bool)((byte)(uVar8 >> 10) & 1);
      auVar78._40_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._40_4_;
      bVar5 = (bool)((byte)(uVar8 >> 0xb) & 1);
      auVar78._44_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._44_4_;
      bVar5 = (bool)((byte)(uVar8 >> 0xc) & 1);
      auVar78._48_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._48_4_;
      bVar5 = (bool)((byte)(uVar8 >> 0xd) & 1);
      auVar78._52_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._52_4_;
      bVar5 = (bool)((byte)(uVar8 >> 0xe) & 1);
      auVar78._56_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._56_4_;
      bVar5 = SUB81(uVar8 >> 0xf,0);
      auVar78._60_4_ = -(uint)bVar5 | (uint)!bVar5 * auVar76._60_4_;
      auVar76 = vmaxps_avx512f(*pauVar50,ZEXT864(0) << 0x20);
      auVar76 = vaddps_avx512f(auVar78,auVar76);
      *pauVar50 = auVar76;
      pauVar50 = pauVar50 + 1;
    }
    for (; iVar51 + 7 < iVar49; iVar51 = iVar51 + 8) {
      auVar71 = *(undefined1 (*) [32])*pauVar50;
      auVar63._8_4_ = 0x80000000;
      auVar63._0_8_ = 0x8000000080000000;
      auVar63._12_4_ = 0x80000000;
      auVar63._16_4_ = 0x80000000;
      auVar63._20_4_ = 0x80000000;
      auVar63._24_4_ = 0x80000000;
      auVar63._28_4_ = 0x80000000;
      auVar63 = vorps_avx512vl(auVar71,auVar63);
      auVar64._8_4_ = 0x42b0c0a5;
      auVar64._0_8_ = 0x42b0c0a542b0c0a5;
      auVar64._12_4_ = 0x42b0c0a5;
      auVar64._16_4_ = 0x42b0c0a5;
      auVar64._20_4_ = 0x42b0c0a5;
      auVar64._24_4_ = 0x42b0c0a5;
      auVar64._28_4_ = 0x42b0c0a5;
      auVar63 = vminps_avx512vl(auVar63,auVar64);
      auVar65._8_4_ = 0xc2b0c0a5;
      auVar65._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar65._12_4_ = 0xc2b0c0a5;
      auVar65._16_4_ = 0xc2b0c0a5;
      auVar65._20_4_ = 0xc2b0c0a5;
      auVar65._24_4_ = 0xc2b0c0a5;
      auVar65._28_4_ = 0xc2b0c0a5;
      auVar64 = vmaxps_avx512vl(auVar63,auVar65);
      auVar100._8_4_ = 0x3f000000;
      auVar100._0_8_ = 0x3f0000003f000000;
      auVar100._12_4_ = 0x3f000000;
      auVar100._16_4_ = 0x3f000000;
      auVar100._20_4_ = 0x3f000000;
      auVar100._24_4_ = 0x3f000000;
      auVar100._28_4_ = 0x3f000000;
      auVar66._8_4_ = 0x3fb8aa3b;
      auVar66._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar66._12_4_ = 0x3fb8aa3b;
      auVar66._16_4_ = 0x3fb8aa3b;
      auVar66._20_4_ = 0x3fb8aa3b;
      auVar66._24_4_ = 0x3fb8aa3b;
      auVar66._28_4_ = 0x3fb8aa3b;
      auVar65 = vfmadd231ps_avx512vl(auVar100,auVar64,auVar66);
      auVar63 = vroundps_avx(auVar65,1);
      uVar7 = vcmpps_avx512vl(auVar65,auVar63,1);
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = 0x3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar102._16_4_ = 0x3f800000;
      auVar102._20_4_ = 0x3f800000;
      auVar102._24_4_ = 0x3f800000;
      auVar102._28_4_ = 0x3f800000;
      auVar66 = vsubps_avx512vl(auVar63,auVar102);
      bVar5 = (bool)((byte)uVar7 & 1);
      auVar67._0_4_ = (float)((uint)bVar5 * auVar66._0_4_ | (uint)!bVar5 * auVar63._0_4_);
      bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar67._4_4_ = (float)((uint)bVar5 * auVar66._4_4_ | (uint)!bVar5 * auVar63._4_4_);
      bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar67._8_4_ = (float)((uint)bVar5 * auVar66._8_4_ | (uint)!bVar5 * auVar63._8_4_);
      bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar67._12_4_ = (float)((uint)bVar5 * auVar66._12_4_ | (uint)!bVar5 * auVar63._12_4_);
      bVar5 = (bool)((byte)(uVar7 >> 4) & 1);
      auVar67._16_4_ = (float)((uint)bVar5 * auVar66._16_4_ | (uint)!bVar5 * auVar63._16_4_);
      bVar5 = (bool)((byte)(uVar7 >> 5) & 1);
      auVar67._20_4_ = (float)((uint)bVar5 * auVar66._20_4_ | (uint)!bVar5 * auVar63._20_4_);
      bVar5 = (bool)((byte)(uVar7 >> 6) & 1);
      auVar67._24_4_ = (float)((uint)bVar5 * auVar66._24_4_ | (uint)!bVar5 * auVar63._24_4_);
      bVar5 = SUB81(uVar7 >> 7,0);
      auVar67._28_4_ = (float)((uint)bVar5 * auVar66._28_4_ | (uint)!bVar5 * auVar63._28_4_);
      auVar104._8_4_ = 0x3f318000;
      auVar104._0_8_ = 0x3f3180003f318000;
      auVar104._12_4_ = 0x3f318000;
      auVar104._16_4_ = 0x3f318000;
      auVar104._20_4_ = 0x3f318000;
      auVar104._24_4_ = 0x3f318000;
      auVar104._28_4_ = 0x3f318000;
      auVar62 = vfmsub231ps_fma(auVar64,auVar67,auVar104);
      auVar106._8_4_ = 0xb95e8083;
      auVar106._0_8_ = 0xb95e8083b95e8083;
      auVar106._12_4_ = 0xb95e8083;
      auVar106._16_4_ = 0xb95e8083;
      auVar106._20_4_ = 0xb95e8083;
      auVar106._24_4_ = 0xb95e8083;
      auVar106._28_4_ = 0xb95e8083;
      auVar62 = vfnmsub231ps_fma(ZEXT1632(auVar62),auVar67,auVar106);
      auVar64 = ZEXT1632(auVar62);
      auVar46._28_4_ = auVar65._28_4_;
      auVar46._0_28_ =
           ZEXT1628(CONCAT412(auVar62._12_4_ * auVar62._12_4_,
                              CONCAT48(auVar62._8_4_ * auVar62._8_4_,
                                       CONCAT44(auVar62._4_4_ * auVar62._4_4_,
                                                auVar62._0_4_ * auVar62._0_4_))));
      auVar97._8_4_ = 0x39506967;
      auVar97._0_8_ = 0x3950696739506967;
      auVar97._12_4_ = 0x39506967;
      auVar97._16_4_ = 0x39506967;
      auVar97._20_4_ = 0x39506967;
      auVar97._24_4_ = 0x39506967;
      auVar97._28_4_ = 0x39506967;
      auVar28._8_4_ = 0x3ab743ce;
      auVar28._0_8_ = 0x3ab743ce3ab743ce;
      auVar28._12_4_ = 0x3ab743ce;
      auVar28._16_4_ = 0x3ab743ce;
      auVar28._20_4_ = 0x3ab743ce;
      auVar28._24_4_ = 0x3ab743ce;
      auVar28._28_4_ = 0x3ab743ce;
      auVar63 = vfmadd213ps_avx512vl(auVar97,auVar64,auVar28);
      auVar29._8_4_ = 0x3c088908;
      auVar29._0_8_ = 0x3c0889083c088908;
      auVar29._12_4_ = 0x3c088908;
      auVar29._16_4_ = 0x3c088908;
      auVar29._20_4_ = 0x3c088908;
      auVar29._24_4_ = 0x3c088908;
      auVar29._28_4_ = 0x3c088908;
      auVar63 = vfmadd213ps_avx512vl(auVar63,auVar64,auVar29);
      auVar30._8_4_ = 0x3d2aa9c1;
      auVar30._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar30._12_4_ = 0x3d2aa9c1;
      auVar30._16_4_ = 0x3d2aa9c1;
      auVar30._20_4_ = 0x3d2aa9c1;
      auVar30._24_4_ = 0x3d2aa9c1;
      auVar30._28_4_ = 0x3d2aa9c1;
      auVar63 = vfmadd213ps_avx512vl(auVar63,auVar64,auVar30);
      auVar31._8_4_ = 0x3e2aaaaa;
      auVar31._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar31._12_4_ = 0x3e2aaaaa;
      auVar31._16_4_ = 0x3e2aaaaa;
      auVar31._20_4_ = 0x3e2aaaaa;
      auVar31._24_4_ = 0x3e2aaaaa;
      auVar31._28_4_ = 0x3e2aaaaa;
      auVar64 = ZEXT1632(auVar62);
      auVar63 = vfmadd213ps_avx512vl(auVar63,auVar64,auVar31);
      auVar62 = vfmadd213ps_fma(auVar63,auVar64,auVar100);
      auVar62 = vfmadd213ps_fma(ZEXT1632(auVar62),auVar46,auVar64);
      auVar87._0_4_ = auVar62._0_4_ + 1.0;
      auVar87._4_4_ = auVar62._4_4_ + 1.0;
      auVar87._8_4_ = auVar62._8_4_ + 1.0;
      auVar87._12_4_ = auVar62._12_4_ + 1.0;
      auVar87._16_4_ = 0x3f800000;
      auVar87._20_4_ = 0x3f800000;
      auVar87._24_4_ = 0x3f800000;
      auVar87._28_4_ = 0x3f800000;
      auVar90._0_4_ = (int)auVar67._0_4_;
      auVar90._4_4_ = (int)auVar67._4_4_;
      auVar90._8_4_ = (int)auVar67._8_4_;
      auVar90._12_4_ = (int)auVar67._12_4_;
      auVar90._16_4_ = (int)auVar67._16_4_;
      auVar90._20_4_ = (int)auVar67._20_4_;
      auVar90._24_4_ = (int)auVar67._24_4_;
      auVar90._28_4_ = (int)auVar67._28_4_;
      auVar63 = vpslld_avx2(auVar90,0x17);
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar32._16_4_ = 0x3f800000;
      auVar32._20_4_ = 0x3f800000;
      auVar32._24_4_ = 0x3f800000;
      auVar32._28_4_ = 0x3f800000;
      auVar63 = vpaddd_avx512vl(auVar63,auVar32);
      auVar62 = vfmadd213ps_fma(auVar63,auVar87,auVar102);
      uVar7 = vcmpps_avx512vl(ZEXT1632(auVar62),ZEXT1632(ZEXT816(0) << 0x40),2);
      auVar33._8_4_ = 0x800000;
      auVar33._0_8_ = 0x80000000800000;
      auVar33._12_4_ = 0x800000;
      auVar33._16_4_ = 0x800000;
      auVar33._20_4_ = 0x800000;
      auVar33._24_4_ = 0x800000;
      auVar33._28_4_ = 0x800000;
      auVar63 = vmaxps_avx512vl(ZEXT1632(auVar62),auVar33);
      auVar66 = vpsrld_avx2(auVar63,0x17);
      auVar93._8_4_ = 0x807fffff;
      auVar93._0_8_ = 0x807fffff807fffff;
      auVar93._12_4_ = 0x807fffff;
      auVar93._16_4_ = 0x807fffff;
      auVar93._20_4_ = 0x807fffff;
      auVar93._24_4_ = 0x807fffff;
      auVar93._28_4_ = 0x807fffff;
      auVar34._8_4_ = 0x3f000000;
      auVar34._0_8_ = 0x3f0000003f000000;
      auVar34._12_4_ = 0x3f000000;
      auVar34._16_4_ = 0x3f000000;
      auVar34._20_4_ = 0x3f000000;
      auVar34._24_4_ = 0x3f000000;
      auVar34._28_4_ = 0x3f000000;
      auVar63 = vpternlogd_avx512vl(auVar63,auVar93,auVar34,0xea);
      auVar35._8_4_ = 0x3f3504f3;
      auVar35._0_8_ = 0x3f3504f33f3504f3;
      auVar35._12_4_ = 0x3f3504f3;
      auVar35._16_4_ = 0x3f3504f3;
      auVar35._20_4_ = 0x3f3504f3;
      auVar35._24_4_ = 0x3f3504f3;
      auVar35._28_4_ = 0x3f3504f3;
      uVar8 = vcmpps_avx512vl(auVar63,auVar35,1);
      auVar36._8_4_ = 0xbf800000;
      auVar36._0_8_ = 0xbf800000bf800000;
      auVar36._12_4_ = 0xbf800000;
      auVar36._16_4_ = 0xbf800000;
      auVar36._20_4_ = 0xbf800000;
      auVar36._24_4_ = 0xbf800000;
      auVar36._28_4_ = 0xbf800000;
      auVar64 = vaddps_avx512vl(auVar63,auVar36);
      auVar65 = vaddps_avx512vl(auVar64,auVar63);
      bVar5 = (bool)((byte)uVar8 & 1);
      auVar68._0_4_ = (float)((uint)bVar5 * auVar65._0_4_ | (uint)!bVar5 * auVar64._0_4_);
      bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar68._4_4_ = (float)((uint)bVar5 * auVar65._4_4_ | (uint)!bVar5 * auVar64._4_4_);
      bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar68._8_4_ = (float)((uint)bVar5 * auVar65._8_4_ | (uint)!bVar5 * auVar64._8_4_);
      bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar68._12_4_ = (float)((uint)bVar5 * auVar65._12_4_ | (uint)!bVar5 * auVar64._12_4_);
      bVar5 = (bool)((byte)(uVar8 >> 4) & 1);
      auVar68._16_4_ = (float)((uint)bVar5 * auVar65._16_4_ | (uint)!bVar5 * auVar64._16_4_);
      bVar5 = (bool)((byte)(uVar8 >> 5) & 1);
      auVar68._20_4_ = (float)((uint)bVar5 * auVar65._20_4_ | (uint)!bVar5 * auVar64._20_4_);
      bVar5 = (bool)((byte)(uVar8 >> 6) & 1);
      auVar68._24_4_ = (float)((uint)bVar5 * auVar65._24_4_ | (uint)!bVar5 * auVar64._24_4_);
      bVar5 = SUB81(uVar8 >> 7,0);
      auVar68._28_4_ = (uint)bVar5 * auVar65._28_4_ | (uint)!bVar5 * auVar64._28_4_;
      auVar47._4_4_ = auVar68._4_4_ * auVar68._4_4_;
      auVar47._0_4_ = auVar68._0_4_ * auVar68._0_4_;
      auVar47._8_4_ = auVar68._8_4_ * auVar68._8_4_;
      auVar47._12_4_ = auVar68._12_4_ * auVar68._12_4_;
      auVar47._16_4_ = auVar68._16_4_ * auVar68._16_4_;
      auVar47._20_4_ = auVar68._20_4_ * auVar68._20_4_;
      auVar47._24_4_ = auVar68._24_4_ * auVar68._24_4_;
      auVar47._28_4_ = auVar63._28_4_;
      auVar98._8_4_ = 0x3d9021bb;
      auVar98._0_8_ = 0x3d9021bb3d9021bb;
      auVar98._12_4_ = 0x3d9021bb;
      auVar98._16_4_ = 0x3d9021bb;
      auVar98._20_4_ = 0x3d9021bb;
      auVar98._24_4_ = 0x3d9021bb;
      auVar98._28_4_ = 0x3d9021bb;
      auVar37._8_4_ = 0xbdebd1b8;
      auVar37._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar37._12_4_ = 0xbdebd1b8;
      auVar37._16_4_ = 0xbdebd1b8;
      auVar37._20_4_ = 0xbdebd1b8;
      auVar37._24_4_ = 0xbdebd1b8;
      auVar37._28_4_ = 0xbdebd1b8;
      auVar63 = vfmadd213ps_avx512vl(auVar98,auVar68,auVar37);
      auVar38._8_4_ = 0x3def251a;
      auVar38._0_8_ = 0x3def251a3def251a;
      auVar38._12_4_ = 0x3def251a;
      auVar38._16_4_ = 0x3def251a;
      auVar38._20_4_ = 0x3def251a;
      auVar38._24_4_ = 0x3def251a;
      auVar38._28_4_ = 0x3def251a;
      auVar63 = vfmadd213ps_avx512vl(auVar63,auVar68,auVar38);
      auVar39._8_4_ = 0xbdfe5d4f;
      auVar39._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar39._12_4_ = 0xbdfe5d4f;
      auVar39._16_4_ = 0xbdfe5d4f;
      auVar39._20_4_ = 0xbdfe5d4f;
      auVar39._24_4_ = 0xbdfe5d4f;
      auVar39._28_4_ = 0xbdfe5d4f;
      auVar63 = vfmadd213ps_avx512vl(auVar63,auVar68,auVar39);
      auVar40._8_4_ = 0x3e11e9bf;
      auVar40._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar40._12_4_ = 0x3e11e9bf;
      auVar40._16_4_ = 0x3e11e9bf;
      auVar40._20_4_ = 0x3e11e9bf;
      auVar40._24_4_ = 0x3e11e9bf;
      auVar40._28_4_ = 0x3e11e9bf;
      auVar63 = vfmadd213ps_avx512vl(auVar63,auVar68,auVar40);
      auVar41._8_4_ = 0xbe2aae50;
      auVar41._0_8_ = 0xbe2aae50be2aae50;
      auVar41._12_4_ = 0xbe2aae50;
      auVar41._16_4_ = 0xbe2aae50;
      auVar41._20_4_ = 0xbe2aae50;
      auVar41._24_4_ = 0xbe2aae50;
      auVar41._28_4_ = 0xbe2aae50;
      auVar63 = vfmadd213ps_avx512vl(auVar63,auVar68,auVar41);
      auVar42._8_4_ = 0x3e4cceac;
      auVar42._0_8_ = 0x3e4cceac3e4cceac;
      auVar42._12_4_ = 0x3e4cceac;
      auVar42._16_4_ = 0x3e4cceac;
      auVar42._20_4_ = 0x3e4cceac;
      auVar42._24_4_ = 0x3e4cceac;
      auVar42._28_4_ = 0x3e4cceac;
      auVar63 = vfmadd213ps_avx512vl(auVar63,auVar68,auVar42);
      auVar43._8_4_ = 0xbe7ffffc;
      auVar43._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar43._12_4_ = 0xbe7ffffc;
      auVar43._16_4_ = 0xbe7ffffc;
      auVar43._20_4_ = 0xbe7ffffc;
      auVar43._24_4_ = 0xbe7ffffc;
      auVar43._28_4_ = 0xbe7ffffc;
      auVar63 = vfmadd213ps_avx512vl(auVar63,auVar68,auVar43);
      auVar44._8_4_ = 0x3eaaaaaa;
      auVar44._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar44._12_4_ = 0x3eaaaaaa;
      auVar44._16_4_ = 0x3eaaaaaa;
      auVar44._20_4_ = 0x3eaaaaaa;
      auVar44._24_4_ = 0x3eaaaaaa;
      auVar44._28_4_ = 0x3eaaaaaa;
      auVar63 = vfmadd213ps_avx512vl(auVar63,auVar68,auVar44);
      auVar48._4_4_ = auVar68._4_4_ * auVar68._4_4_ * auVar68._4_4_ * auVar63._4_4_;
      auVar48._0_4_ = auVar68._0_4_ * auVar68._0_4_ * auVar68._0_4_ * auVar63._0_4_;
      auVar48._8_4_ = auVar68._8_4_ * auVar68._8_4_ * auVar68._8_4_ * auVar63._8_4_;
      auVar48._12_4_ = auVar68._12_4_ * auVar68._12_4_ * auVar68._12_4_ * auVar63._12_4_;
      auVar48._16_4_ = auVar68._16_4_ * auVar68._16_4_ * auVar68._16_4_ * auVar63._16_4_;
      auVar48._20_4_ = auVar68._20_4_ * auVar68._20_4_ * auVar68._20_4_ * auVar63._20_4_;
      auVar48._24_4_ = auVar68._24_4_ * auVar68._24_4_ * auVar68._24_4_ * auVar63._24_4_;
      auVar48._28_4_ = auVar63._28_4_;
      auVar45._8_4_ = 0xffffff82;
      auVar45._0_8_ = 0xffffff82ffffff82;
      auVar45._12_4_ = 0xffffff82;
      auVar45._16_4_ = 0xffffff82;
      auVar45._20_4_ = 0xffffff82;
      auVar45._24_4_ = 0xffffff82;
      auVar45._28_4_ = 0xffffff82;
      auVar63 = vpaddd_avx512vl(auVar66,auVar45);
      auVar63 = vcvtdq2ps_avx(auVar63);
      auVar64 = vsubps_avx512vl(auVar63,auVar102);
      bVar5 = (bool)((byte)uVar8 & 1);
      auVar69._0_4_ = (uint)bVar5 * auVar64._0_4_ | (uint)!bVar5 * auVar63._0_4_;
      bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar69._4_4_ = (uint)bVar5 * auVar64._4_4_ | (uint)!bVar5 * auVar63._4_4_;
      bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar69._8_4_ = (uint)bVar5 * auVar64._8_4_ | (uint)!bVar5 * auVar63._8_4_;
      bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar69._12_4_ = (uint)bVar5 * auVar64._12_4_ | (uint)!bVar5 * auVar63._12_4_;
      bVar5 = (bool)((byte)(uVar8 >> 4) & 1);
      auVar69._16_4_ = (uint)bVar5 * auVar64._16_4_ | (uint)!bVar5 * auVar63._16_4_;
      bVar5 = (bool)((byte)(uVar8 >> 5) & 1);
      auVar69._20_4_ = (uint)bVar5 * auVar64._20_4_ | (uint)!bVar5 * auVar63._20_4_;
      bVar5 = (bool)((byte)(uVar8 >> 6) & 1);
      auVar69._24_4_ = (uint)bVar5 * auVar64._24_4_ | (uint)!bVar5 * auVar63._24_4_;
      bVar5 = SUB81(uVar8 >> 7,0);
      auVar69._28_4_ = (uint)bVar5 * auVar64._28_4_ | (uint)!bVar5 * auVar63._28_4_;
      auVar62 = vfmadd231ps_fma(auVar48,auVar69,auVar106);
      auVar62 = vfmsub231ps_fma(ZEXT1632(auVar62),auVar100,auVar47);
      auVar63 = vsubps_avx(ZEXT1632(auVar62),auVar68);
      auVar62 = vfmsub231ps_fma(auVar63,auVar104,auVar69);
      uVar8 = vcmpps_avx512vl(ZEXT1632(ZEXT816(0) << 0x40),auVar71,1);
      auVar63 = vpcmpeqd_avx2(auVar69,auVar69);
      bVar5 = (bool)((byte)uVar7 & 1);
      auVar70._0_4_ = (uint)bVar5 * auVar63._0_4_ | (uint)!bVar5 * auVar62._0_4_;
      bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar70._4_4_ = (uint)bVar5 * auVar63._4_4_ | (uint)!bVar5 * auVar62._4_4_;
      bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar70._8_4_ = (uint)bVar5 * auVar63._8_4_ | (uint)!bVar5 * auVar62._8_4_;
      bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar70._12_4_ = (uint)bVar5 * auVar63._12_4_ | (uint)!bVar5 * auVar62._12_4_;
      iVar1 = (uint)((byte)(uVar7 >> 4) & 1) * auVar63._16_4_;
      auVar70._16_4_ = iVar1;
      iVar2 = (uint)((byte)(uVar7 >> 5) & 1) * auVar63._20_4_;
      auVar70._20_4_ = iVar2;
      iVar3 = (uint)((byte)(uVar7 >> 6) & 1) * auVar63._24_4_;
      auVar70._24_4_ = iVar3;
      iVar4 = (uint)(byte)(uVar7 >> 7) * auVar63._28_4_;
      auVar70._28_4_ = iVar4;
      auVar71 = vaddps_avx512vl(auVar70,auVar71);
      bVar5 = (bool)((byte)uVar8 & 1);
      auVar72._0_4_ = (uint)bVar5 * auVar71._0_4_ | !bVar5 * auVar70._0_4_;
      bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar72._4_4_ = (uint)bVar5 * auVar71._4_4_ | !bVar5 * auVar70._4_4_;
      bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar72._8_4_ = (uint)bVar5 * auVar71._8_4_ | !bVar5 * auVar70._8_4_;
      bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar72._12_4_ = (uint)bVar5 * auVar71._12_4_ | !bVar5 * auVar70._12_4_;
      bVar5 = (bool)((byte)(uVar8 >> 4) & 1);
      auVar72._16_4_ = (uint)bVar5 * auVar71._16_4_ | (uint)!bVar5 * iVar1;
      bVar5 = (bool)((byte)(uVar8 >> 5) & 1);
      auVar72._20_4_ = (uint)bVar5 * auVar71._20_4_ | (uint)!bVar5 * iVar2;
      bVar5 = (bool)((byte)(uVar8 >> 6) & 1);
      auVar72._24_4_ = (uint)bVar5 * auVar71._24_4_ | (uint)!bVar5 * iVar3;
      bVar5 = SUB81(uVar8 >> 7,0);
      auVar72._28_4_ = (uint)bVar5 * auVar71._28_4_ | (uint)!bVar5 * iVar4;
      *(undefined1 (*) [32])*pauVar50 = auVar72;
      pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
    }
    for (; iVar51 + 3 < iVar49; iVar51 = iVar51 + 4) {
      auVar62 = *(undefined1 (*) [16])*pauVar50;
      auVar54._8_4_ = 0x80000000;
      auVar54._0_8_ = 0x8000000080000000;
      auVar54._12_4_ = 0x80000000;
      auVar54 = vorps_avx512vl(auVar62,auVar54);
      auVar55._8_4_ = 0x42b0c0a5;
      auVar55._0_8_ = 0x42b0c0a542b0c0a5;
      auVar55._12_4_ = 0x42b0c0a5;
      auVar54 = vminps_avx512vl(auVar54,auVar55);
      auVar56._8_4_ = 0xc2b0c0a5;
      auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar56._12_4_ = 0xc2b0c0a5;
      auVar55 = vmaxps_avx512vl(auVar54,auVar56);
      auVar99._8_4_ = 0x3f000000;
      auVar99._0_8_ = 0x3f0000003f000000;
      auVar99._12_4_ = 0x3f000000;
      auVar9._8_4_ = 0x3fb8aa3b;
      auVar9._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar9._12_4_ = 0x3fb8aa3b;
      auVar56 = vfmadd231ps_avx512vl(auVar99,auVar55,auVar9);
      auVar91._0_4_ = (int)auVar56._0_4_;
      auVar91._4_4_ = (int)auVar56._4_4_;
      auVar91._8_4_ = (int)auVar56._8_4_;
      auVar91._12_4_ = (int)auVar56._12_4_;
      auVar54 = vcvtdq2ps_avx(auVar91);
      uVar7 = vcmpps_avx512vl(auVar56,auVar54,1);
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = 0x3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar56 = vsubps_avx512vl(auVar54,auVar101);
      bVar5 = (bool)((byte)uVar7 & 1);
      auVar57._0_4_ = (float)((uint)bVar5 * auVar56._0_4_ | (uint)!bVar5 * auVar54._0_4_);
      bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar57._4_4_ = (float)((uint)bVar5 * auVar56._4_4_ | (uint)!bVar5 * auVar54._4_4_);
      bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar57._8_4_ = (float)((uint)bVar5 * auVar56._8_4_ | (uint)!bVar5 * auVar54._8_4_);
      bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar57._12_4_ = (float)((uint)bVar5 * auVar56._12_4_ | (uint)!bVar5 * auVar54._12_4_);
      auVar103._8_4_ = 0x3f318000;
      auVar103._0_8_ = 0x3f3180003f318000;
      auVar103._12_4_ = 0x3f318000;
      auVar54 = vfmsub231ps_fma(auVar55,auVar57,auVar103);
      auVar105._8_4_ = 0xb95e8083;
      auVar105._0_8_ = 0xb95e8083b95e8083;
      auVar105._12_4_ = 0xb95e8083;
      auVar55 = vfnmsub231ps_fma(auVar54,auVar57,auVar105);
      auVar88._0_4_ = auVar55._0_4_ * auVar55._0_4_;
      auVar88._4_4_ = auVar55._4_4_ * auVar55._4_4_;
      auVar88._8_4_ = auVar55._8_4_ * auVar55._8_4_;
      auVar88._12_4_ = auVar55._12_4_ * auVar55._12_4_;
      auVar94._8_4_ = 0x39506967;
      auVar94._0_8_ = 0x3950696739506967;
      auVar94._12_4_ = 0x39506967;
      auVar10._8_4_ = 0x3ab743ce;
      auVar10._0_8_ = 0x3ab743ce3ab743ce;
      auVar10._12_4_ = 0x3ab743ce;
      auVar54 = vfmadd213ps_avx512vl(auVar94,auVar55,auVar10);
      auVar11._8_4_ = 0x3c088908;
      auVar11._0_8_ = 0x3c0889083c088908;
      auVar11._12_4_ = 0x3c088908;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar55,auVar11);
      auVar12._8_4_ = 0x3d2aa9c1;
      auVar12._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar12._12_4_ = 0x3d2aa9c1;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar55,auVar12);
      auVar13._8_4_ = 0x3e2aaaaa;
      auVar13._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar13._12_4_ = 0x3e2aaaaa;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar55,auVar13);
      auVar54 = vfmadd213ps_fma(auVar54,auVar55,auVar99);
      auVar54 = vfmadd213ps_fma(auVar54,auVar88,auVar55);
      auVar85._0_4_ = auVar54._0_4_ + 1.0;
      auVar85._4_4_ = auVar54._4_4_ + 1.0;
      auVar85._8_4_ = auVar54._8_4_ + 1.0;
      auVar85._12_4_ = auVar54._12_4_ + 1.0;
      auVar89._0_4_ = (int)auVar57._0_4_;
      auVar89._4_4_ = (int)auVar57._4_4_;
      auVar89._8_4_ = (int)auVar57._8_4_;
      auVar89._12_4_ = (int)auVar57._12_4_;
      auVar54 = vpslld_avx(auVar89,0x17);
      auVar14._8_4_ = 0x3f800000;
      auVar14._0_8_ = 0x3f8000003f800000;
      auVar14._12_4_ = 0x3f800000;
      auVar54 = vpaddd_avx512vl(auVar54,auVar14);
      auVar54 = vfmadd213ps_fma(auVar54,auVar85,auVar101);
      uVar7 = vcmpps_avx512vl(auVar54,ZEXT816(0) << 0x40,2);
      auVar15._8_4_ = 0x800000;
      auVar15._0_8_ = 0x80000000800000;
      auVar15._12_4_ = 0x800000;
      auVar54 = vmaxps_avx512vl(auVar54,auVar15);
      auVar56 = vpsrld_avx(auVar54,0x17);
      auVar92._8_4_ = 0x807fffff;
      auVar92._0_8_ = 0x807fffff807fffff;
      auVar92._12_4_ = 0x807fffff;
      auVar16._8_4_ = 0x3f000000;
      auVar16._0_8_ = 0x3f0000003f000000;
      auVar16._12_4_ = 0x3f000000;
      auVar54 = vpternlogd_avx512vl(auVar54,auVar92,auVar16,0xea);
      auVar17._8_4_ = 0x3f3504f3;
      auVar17._0_8_ = 0x3f3504f33f3504f3;
      auVar17._12_4_ = 0x3f3504f3;
      uVar8 = vcmpps_avx512vl(auVar54,auVar17,1);
      auVar18._8_4_ = 0xbf800000;
      auVar18._0_8_ = 0xbf800000bf800000;
      auVar18._12_4_ = 0xbf800000;
      auVar55 = vaddps_avx512vl(auVar54,auVar18);
      auVar54 = vaddps_avx512vl(auVar55,auVar54);
      bVar5 = (bool)((byte)uVar8 & 1);
      auVar58._0_4_ = (float)((uint)bVar5 * auVar54._0_4_ | (uint)!bVar5 * auVar55._0_4_);
      bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar58._4_4_ = (float)((uint)bVar5 * auVar54._4_4_ | (uint)!bVar5 * auVar55._4_4_);
      bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar58._8_4_ = (float)((uint)bVar5 * auVar54._8_4_ | (uint)!bVar5 * auVar55._8_4_);
      bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar58._12_4_ = (float)((uint)bVar5 * auVar54._12_4_ | (uint)!bVar5 * auVar55._12_4_);
      auVar86._0_4_ = auVar58._0_4_ * auVar58._0_4_;
      auVar86._4_4_ = auVar58._4_4_ * auVar58._4_4_;
      auVar86._8_4_ = auVar58._8_4_ * auVar58._8_4_;
      auVar86._12_4_ = auVar58._12_4_ * auVar58._12_4_;
      auVar95._8_4_ = 0x3d9021bb;
      auVar95._0_8_ = 0x3d9021bb3d9021bb;
      auVar95._12_4_ = 0x3d9021bb;
      auVar19._8_4_ = 0xbdebd1b8;
      auVar19._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar19._12_4_ = 0xbdebd1b8;
      auVar54 = vfmadd213ps_avx512vl(auVar95,auVar58,auVar19);
      auVar20._8_4_ = 0x3def251a;
      auVar20._0_8_ = 0x3def251a3def251a;
      auVar20._12_4_ = 0x3def251a;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar58,auVar20);
      auVar21._8_4_ = 0xbdfe5d4f;
      auVar21._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar21._12_4_ = 0xbdfe5d4f;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar58,auVar21);
      auVar22._8_4_ = 0x3e11e9bf;
      auVar22._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar22._12_4_ = 0x3e11e9bf;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar58,auVar22);
      auVar23._8_4_ = 0xbe2aae50;
      auVar23._0_8_ = 0xbe2aae50be2aae50;
      auVar23._12_4_ = 0xbe2aae50;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar58,auVar23);
      auVar24._8_4_ = 0x3e4cceac;
      auVar24._0_8_ = 0x3e4cceac3e4cceac;
      auVar24._12_4_ = 0x3e4cceac;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar58,auVar24);
      auVar25._8_4_ = 0xbe7ffffc;
      auVar25._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar25._12_4_ = 0xbe7ffffc;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar58,auVar25);
      auVar26._8_4_ = 0x3eaaaaaa;
      auVar26._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar26._12_4_ = 0x3eaaaaaa;
      auVar54 = vfmadd213ps_avx512vl(auVar54,auVar58,auVar26);
      auVar96._0_4_ = auVar86._0_4_ * auVar58._0_4_ * auVar54._0_4_;
      auVar96._4_4_ = auVar86._4_4_ * auVar58._4_4_ * auVar54._4_4_;
      auVar96._8_4_ = auVar86._8_4_ * auVar58._8_4_ * auVar54._8_4_;
      auVar96._12_4_ = auVar86._12_4_ * auVar58._12_4_ * auVar54._12_4_;
      auVar27._8_4_ = 0xffffff82;
      auVar27._0_8_ = 0xffffff82ffffff82;
      auVar27._12_4_ = 0xffffff82;
      auVar54 = vpaddd_avx512vl(auVar56,auVar27);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar55 = vsubps_avx512vl(auVar54,auVar101);
      bVar5 = (bool)((byte)uVar8 & 1);
      auVar59._0_4_ = (uint)bVar5 * auVar55._0_4_ | (uint)!bVar5 * auVar54._0_4_;
      bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar59._4_4_ = (uint)bVar5 * auVar55._4_4_ | (uint)!bVar5 * auVar54._4_4_;
      bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar59._8_4_ = (uint)bVar5 * auVar55._8_4_ | (uint)!bVar5 * auVar54._8_4_;
      bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar59._12_4_ = (uint)bVar5 * auVar55._12_4_ | (uint)!bVar5 * auVar54._12_4_;
      auVar54 = vfmadd231ps_fma(auVar96,auVar59,auVar105);
      auVar54 = vfmsub231ps_fma(auVar54,auVar99,auVar86);
      auVar54 = vsubps_avx(auVar54,auVar58);
      auVar55 = vfmsub231ps_fma(auVar54,auVar103,auVar59);
      uVar8 = vcmpps_avx512vl(ZEXT816(0) << 0x40,auVar62,1);
      auVar54 = vpcmpeqd_avx(auVar59,auVar59);
      bVar5 = (bool)((byte)uVar7 & 1);
      auVar60._0_4_ = (uint)bVar5 * auVar54._0_4_ | (uint)!bVar5 * auVar55._0_4_;
      bVar5 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar60._4_4_ = (uint)bVar5 * auVar54._4_4_ | (uint)!bVar5 * auVar55._4_4_;
      bVar5 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar60._8_4_ = (uint)bVar5 * auVar54._8_4_ | (uint)!bVar5 * auVar55._8_4_;
      bVar5 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar60._12_4_ = (uint)bVar5 * auVar54._12_4_ | (uint)!bVar5 * auVar55._12_4_;
      auVar62 = vaddps_avx512vl(auVar60,auVar62);
      bVar5 = (bool)((byte)uVar8 & 1);
      auVar61._0_4_ = (uint)bVar5 * auVar62._0_4_ | !bVar5 * auVar60._0_4_;
      bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar61._4_4_ = (uint)bVar5 * auVar62._4_4_ | !bVar5 * auVar60._4_4_;
      bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar61._8_4_ = (uint)bVar5 * auVar62._8_4_ | !bVar5 * auVar60._8_4_;
      bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar61._12_4_ = (uint)bVar5 * auVar62._12_4_ | !bVar5 * auVar60._12_4_;
      *(undefined1 (*) [16])*pauVar50 = auVar61;
      pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
    }
    for (; iVar51 < iVar49; iVar51 = iVar51 + 1) {
      fVar84 = *(float *)*pauVar50;
      if (fVar84 <= 0.0) {
        fVar84 = expf(fVar84);
        fVar83 = logf(fVar84 + 1.0);
      }
      else {
        auVar62._8_4_ = 0x80000000;
        auVar62._0_8_ = 0x8000000080000000;
        auVar62._12_4_ = 0x80000000;
        auVar62 = vxorps_avx512vl(ZEXT416((uint)fVar84),auVar62);
        fVar83 = expf(auVar62._0_4_);
        fVar83 = logf(fVar83 + 1.0);
        fVar83 = fVar83 + fVar84;
      }
      *(float *)*pauVar50 = fVar83;
      pauVar50 = (undefined1 (*) [64])(*pauVar50 + 4);
    }
  }
  return 0;
}

Assistant:

int BNLL_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = static_cast<float>(*ptr + log(1.f + exp(-(*ptr))));
            else
                *ptr = static_cast<float>(log(1.f + exp(*ptr)));
            ptr++;
        }
    }
    return 0;
}